

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,int&>(pybind11 *this,int *args_)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  cast_error *this_00;
  PyObject **ppPVar4;
  handle local_100;
  iterator local_f8;
  value_type *arg_value_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_1UL> *__range2_1;
  int counter;
  char local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  iterator local_70;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  handle local_40;
  PyObject *local_38;
  pybind11 *local_30;
  array<pybind11::object,_1UL> local_28;
  array<pybind11::object,_1UL> args;
  size_t size;
  int *args__local;
  tuple *result;
  
  args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x1;
  iVar3 = *args_;
  local_30 = (pybind11 *)&local_28;
  handle::handle(&local_40,(PyObject *)0x0);
  local_38 = (PyObject *)detail::type_caster<int,_void>::cast(iVar3,automatic_reference,local_40);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_28,(handle)local_38);
  __begin0 = local_28._M_elems;
  __end0 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)__begin0);
  arg_value = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)__begin0);
  while( true ) {
    if (__end0 == arg_value) {
      __range2_1._6_1_ = 0;
      tuple::tuple((tuple *)this,1);
      __range2_1._0_4_ = 0;
      __begin0_1 = local_28._M_elems;
      __end0_1 = std::array<pybind11::object,_1UL>::begin
                           ((array<pybind11::object,_1UL> *)__begin0_1);
      arg_value_1 = std::array<pybind11::object,_1UL>::end
                              ((array<pybind11::object,_1UL> *)__begin0_1);
      while( true ) {
        if (__end0_1 == arg_value_1) {
          __range2_1._6_1_ = 1;
          std::array<pybind11::object,_1UL>::~array(&local_28);
          return (object)(object)this;
        }
        local_f8 = __end0_1;
        local_100 = object::release(__end0_1);
        ppPVar4 = handle::ptr(&local_100);
        pPVar1 = (PyTypeObject *)*ppPVar4;
        ppPVar4 = handle::ptr((handle *)this);
        iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x4000000);
        if (iVar3 == 0) break;
        ppPVar4 = handle::ptr((handle *)this);
        (&(*ppPVar4)[1].ob_type)[(int)__range2_1] = pPVar1;
        __end0_1 = __end0_1 + 1;
        __range2_1._0_4_ = (int)__range2_1 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                    ,0x496,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <int &>]"
                   );
    }
    local_70 = __end0;
    bVar2 = handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) break;
    __end0 = __end0 + 1;
  }
  __range2_1._7_1_ = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  type_id<std::tuple<int&>>();
  std::operator+(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "make_tuple(): unable to convert arguments of types \'");
  std::operator+(local_90,local_b0);
  cast_error::runtime_error(this_00,local_90);
  __range2_1._7_1_ = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}